

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffpcks(fitsfile *fptr,int *status)

{
  int iVar1;
  double dVar2;
  double tdouble;
  unsigned_long sum;
  unsigned_long olddsum;
  unsigned_long dsum;
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  long nrec;
  char local_1c8 [4];
  int tstatus;
  char datacomm [73];
  char chkcomm [73];
  char comm [73];
  char datasum [71];
  char local_88 [8];
  char checksum [71];
  char local_38 [8];
  char datestr [20];
  int *status_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x10000593 = status;
    ffgstm(local_38,(int *)0x0,status);
    strcpy(datacomm + 0x48,"HDU checksum updated ");
    strcat(datacomm + 0x48,local_38);
    strcpy(local_1c8,"data unit checksum updated ");
    strcat(local_1c8,local_38);
    nrec._4_4_ = *stack0xffffffffffffffe0;
    iVar1 = ffgkys(fptr,"CHECKSUM",local_88,chkcomm + 0x48,stack0xffffffffffffffe0);
    if (iVar1 == 0xca) {
      *stack0xffffffffffffffe0 = nrec._4_4_;
      strcpy(local_88,"0000000000000000");
      ffpkys(fptr,"CHECKSUM",local_88,datacomm + 0x48,stack0xffffffffffffffe0);
    }
    nrec._4_4_ = *stack0xffffffffffffffe0;
    iVar1 = ffgkys(fptr,"DATASUM",comm + 0x48,chkcomm + 0x48,stack0xffffffffffffffe0);
    if (iVar1 == 0xca) {
      *stack0xffffffffffffffe0 = nrec._4_4_;
      sum = 0;
      ffpkys(fptr,"DATASUM","         0",local_1c8,stack0xffffffffffffffe0);
      iVar1 = strcmp(local_88,"0000000000000000");
      if (iVar1 != 0) {
        strcpy(local_88,"0000000000000000");
        ffmkys(fptr,"CHECKSUM",local_88,datacomm + 0x48,stack0xffffffffffffffe0);
      }
    }
    else {
      dVar2 = atof(comm + 0x48);
      sum = (long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f;
    }
    iVar1 = ffrdef(fptr,stack0xffffffffffffffe0);
    if (iVar1 < 1) {
      if (0 < fptr->Fptr->heapsize) {
        ffuptf(fptr,stack0xffffffffffffffe0);
      }
      iVar1 = ffpdfl(fptr,stack0xffffffffffffffe0);
      if (iVar1 < 1) {
        iVar1 = ffghadll(fptr,&datastart,&dataend,(LONGLONG *)&dsum,stack0xffffffffffffffe0);
        if (iVar1 < 1) {
          headstart = (long)(dsum - dataend) / 0xb40;
          olddsum = 0;
          if (0 < headstart) {
            ffmbyt(fptr,dataend,0,stack0xffffffffffffffe0);
            iVar1 = ffcsum(fptr,headstart,&olddsum,stack0xffffffffffffffe0);
            if (0 < iVar1) {
              return *stack0xffffffffffffffe0;
            }
          }
          if (olddsum != sum) {
            snprintf(comm + 0x48,0x47,"%lu",olddsum);
            ffmkys(fptr,"DATASUM",comm + 0x48,local_1c8,stack0xffffffffffffffe0);
            iVar1 = strcmp(local_88,"0000000000000000");
            if (iVar1 != 0) {
              strcpy(local_88,"0000000000000000");
              ffmkys(fptr,"CHECKSUM",local_88,datacomm + 0x48,stack0xffffffffffffffe0);
            }
          }
          iVar1 = strcmp(local_88,"0000000000000000");
          if (iVar1 != 0) {
            ffmbyt(fptr,datastart,0,stack0xffffffffffffffe0);
            headstart = (dataend - datastart) / 0xb40;
            tdouble = (double)olddsum;
            iVar1 = ffcsum(fptr,headstart,(unsigned_long *)&tdouble,stack0xffffffffffffffe0);
            if (0 < iVar1) {
              return *stack0xffffffffffffffe0;
            }
            if ((tdouble == 0.0) || (tdouble == 2.12199579047121e-314)) {
              return *stack0xffffffffffffffe0;
            }
            ffmkys(fptr,"CHECKSUM","0000000000000000",datacomm + 0x48,stack0xffffffffffffffe0);
          }
          ffmbyt(fptr,datastart,0,stack0xffffffffffffffe0);
          headstart = (dataend - datastart) / 0xb40;
          tdouble = (double)olddsum;
          iVar1 = ffcsum(fptr,headstart,(unsigned_long *)&tdouble,stack0xffffffffffffffe0);
          if (iVar1 < 1) {
            ffesum((unsigned_long)tdouble,1,local_88);
            ffmkys(fptr,"CHECKSUM",local_88,"&",stack0xffffffffffffffe0);
            fptr_local._4_4_ = *stack0xffffffffffffffe0;
          }
          else {
            fptr_local._4_4_ = *stack0xffffffffffffffe0;
          }
        }
        else {
          fptr_local._4_4_ = *stack0xffffffffffffffe0;
        }
      }
      else {
        fptr_local._4_4_ = *stack0xffffffffffffffe0;
      }
    }
    else {
      fptr_local._4_4_ = *stack0xffffffffffffffe0;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpcks(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *status)         /* IO - error status                      */
/*
   Create or update the checksum keywords in the CHDU.  These keywords
   provide a checksum verification of the FITS HDU based on the ASCII
   coded 1's complement checksum algorithm developed by Rob Seaman at NOAO.
*/
{
    char datestr[20], checksum[FLEN_VALUE], datasum[FLEN_VALUE];
    char  comm[FLEN_COMMENT], chkcomm[FLEN_COMMENT], datacomm[FLEN_COMMENT];
    int tstatus;
    long nrec;
    LONGLONG headstart, datastart, dataend;
    unsigned long dsum, olddsum, sum;
    double tdouble;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* generate current date string and construct the keyword comments */
    ffgstm(datestr, NULL, status);
    strcpy(chkcomm, "HDU checksum updated ");
    strcat(chkcomm, datestr);
    strcpy(datacomm, "data unit checksum updated ");
    strcat(datacomm, datestr);

    /* write the CHECKSUM keyword if it does not exist */
    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", checksum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        strcpy(checksum, "0000000000000000");
        ffpkys(fptr, "CHECKSUM", checksum, chkcomm, status);
    }

    /* write the DATASUM keyword if it does not exist */
    tstatus = *status;
    if (ffgkys(fptr, "DATASUM", datasum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        olddsum = 0;
        ffpkys(fptr, "DATASUM", "         0", datacomm, status);

        /* set the CHECKSUM keyword as undefined, if it isn't already */
        if (strcmp(checksum, "0000000000000000") )
        {
            strcpy(checksum, "0000000000000000");
            ffmkys(fptr, "CHECKSUM", checksum, chkcomm, status);
        }
    }
    else
    {
        /* decode the datasum into an unsigned long variable */

        /* olddsum = strtoul(datasum, 0, 10); doesn't work on SUN OS */

        tdouble = atof(datasum);
        olddsum = (unsigned long) tdouble;
    }

    /* close header: rewrite END keyword and following blank fill */
    /* and re-read the required keywords to determine the structure */
    if (ffrdef(fptr, status) > 0)
        return(*status);

    if ((fptr->Fptr)->heapsize > 0)
         ffuptf(fptr, status);  /* update the variable length TFORM values */

    /* write the correct data fill values, if they are not already correct */
    if (ffpdfl(fptr, status) > 0)
        return(*status);

    /* calc size of data unit, in FITS 2880-byte blocks */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    nrec = (long) ((dataend - datastart) / 2880);
    dsum = 0;

    if (nrec > 0)
    {
        /* accumulate the 32-bit 1's complement checksum */
        ffmbyt(fptr, datastart, REPORT_EOF, status);
        if (ffcsum(fptr, nrec, &dsum, status) > 0)
            return(*status);
    }

    if (dsum != olddsum)
    {
        /* update the DATASUM keyword with the correct value */ 
        snprintf(datasum, FLEN_VALUE, "%lu", dsum);
        ffmkys(fptr, "DATASUM", datasum, datacomm, status);

        /* set the CHECKSUM keyword as undefined, if it isn't already */
        if (strcmp(checksum, "0000000000000000") )
        {
            strcpy(checksum, "0000000000000000");
            ffmkys(fptr, "CHECKSUM", checksum, chkcomm, status);
        }
    }        

    if (strcmp(checksum, "0000000000000000") )
    {
        /* check if CHECKSUM is still OK; move to the start of the header */
        ffmbyt(fptr, headstart, REPORT_EOF, status);

        /* accumulate the header checksum into the previous data checksum */
        nrec = (long) ((datastart - headstart) / 2880);
        sum = dsum;
        if (ffcsum(fptr, nrec, &sum, status) > 0)
            return(*status);

        if (sum == 0 || sum == 0xFFFFFFFF)
           return(*status);            /* CHECKSUM is correct */

        /* Zero the CHECKSUM and recompute the new value */
        ffmkys(fptr, "CHECKSUM", "0000000000000000", chkcomm, status);
    }

    /* move to the start of the header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);

    /* accumulate the header checksum into the previous data checksum */
    nrec = (long) ((datastart - headstart) / 2880);
    sum = dsum;
    if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

    /* encode the COMPLEMENT of the checksum into a 16-character string */
    ffesum(sum, TRUE, checksum);

    /* update the CHECKSUM keyword value with the new string */
    ffmkys(fptr, "CHECKSUM", checksum, "&", status);

    return(*status);
}